

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wabtapi.cc
# Opt level: O0

Features GetWabtFeatures(ChakraContext *ctx)

{
  Features FVar1;
  ChakraContext *ctx_local;
  undefined1 uStack_10;
  undefined1 uStack_f;
  undefined1 uStack_e;
  undefined1 uStack_d;
  undefined1 uStack_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  Features features;
  
  wabt::Features::Features((Features *)((long)&ctx_local + 7));
  if (((byte)ctx->features & 1) != 0) {
    wabt::Features::enable_sign_extension((Features *)((long)&ctx_local + 7));
  }
  if (((byte)ctx->features >> 1 & 1) != 0) {
    wabt::Features::enable_threads((Features *)((long)&ctx_local + 7));
  }
  if (((byte)ctx->features >> 2 & 1) != 0) {
    wabt::Features::enable_simd((Features *)((long)&ctx_local + 7));
  }
  if (((byte)ctx->features >> 3 & 1) != 0) {
    wabt::Features::enable_sat_float_to_int((Features *)((long)&ctx_local + 7));
  }
  wabt::Features::enable_mutable_globals((Features *)((long)&ctx_local + 7));
  FVar1.bulk_memory_enabled_ = features.exceptions_enabled_;
  FVar1.exceptions_enabled_ = (bool)ctx_local._7_1_;
  FVar1.mutable_globals_enabled_ = (bool)uStack_10;
  FVar1.sat_float_to_int_enabled_ = (bool)uStack_f;
  FVar1.sign_extension_enabled_ = (bool)uStack_e;
  FVar1.simd_enabled_ = (bool)uStack_d;
  FVar1.threads_enabled_ = (bool)uStack_c;
  FVar1.multi_value_enabled_ = (bool)uStack_b;
  FVar1.tail_call_enabled_ = (bool)uStack_a;
  return FVar1;
}

Assistant:

Features GetWabtFeatures(const ChakraContext& ctx)
{
    Features features;
    if (ctx.features.sign_extends)
    {
        features.enable_sign_extension();
    }
    if (ctx.features.threads)
    {
        features.enable_threads();
    }
    if (ctx.features.simd)
    {
        features.enable_simd();
    }
    if (ctx.features.sat_float_to_int)
    {
        features.enable_sat_float_to_int();
    }

    // Enable wabt features that have made it into the spec
    features.enable_mutable_globals();
    return features;
}